

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar1;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  ushort uVar3;
  KeyValue *pKVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  KeyValue *pKVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar8;
  int local_3c;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_38;
  
  pKVar4 = (this->map_).flat;
  local_3c = key;
  if (0x100 < this->flat_capacity_) {
    local_38.second.field_0.int64_value = 0;
    local_38.second.type = '\0';
    local_38.second.is_repeated = false;
    local_38.second._10_1_ = 0;
    local_38.second.is_packed = false;
    local_38.second.cached_size = 0;
    local_38.second.descriptor = (FieldDescriptor *)0x0;
    local_38.first = key;
    pVar8 = std::
            _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
            ::
            _M_insert_unique<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                      ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                        *)pKVar4,&local_38);
    pVar7._8_8_ = pVar8._8_8_;
    pVar7.first = (Extension *)&pVar8.first._M_node._M_node[1]._M_parent;
    return pVar7;
  }
  pKVar6 = pKVar4 + this->flat_size_;
  pKVar4 = std::
           __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                     (pKVar4,pKVar6,&local_3c);
  if (pKVar4 == pKVar6) {
    uVar3 = this->flat_size_;
    uVar5 = extraout_RDX;
    if (this->flat_capacity_ <= uVar3) goto LAB_00281028;
  }
  else {
    if (pKVar4->first == local_3c) {
      pVar1._8_8_ = 0;
      pVar1.first = &pKVar4->second;
      return pVar1;
    }
    uVar3 = this->flat_size_;
    if (this->flat_capacity_ <= uVar3) {
LAB_00281028:
      GrowCapacity(this,(ulong)uVar3 + 1);
      pVar7 = Insert(this,local_3c);
      return pVar7;
    }
    memmove(pKVar4 + 1,pKVar4,(long)pKVar6 - (long)pKVar4);
    uVar3 = this->flat_size_;
    uVar5 = extraout_RDX_00;
  }
  this->flat_size_ = uVar3 + 1;
  pKVar4->first = local_3c;
  (pKVar4->second).field_0.int64_value = 0;
  (pKVar4->second).type = '\0';
  (pKVar4->second).is_repeated = false;
  (pKVar4->second).field_0xa = 0;
  (pKVar4->second).is_packed = false;
  (pKVar4->second).cached_size = 0;
  (pKVar4->second).descriptor = (FieldDescriptor *)0x0;
  pVar2._9_7_ = (int7)((ulong)uVar5 >> 8);
  pVar2.second = true;
  pVar2.first = &pKVar4->second;
  return pVar2;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    auto maybe = map_.large->insert({key, Extension()});
    return {&maybe.first->second, maybe.second};
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return {&it->second, false};
  }
  if (flat_size_ < flat_capacity_) {
    std::copy_backward(it, end, end + 1);
    ++flat_size_;
    it->first = key;
    it->second = Extension();
    return {&it->second, true};
  }
  GrowCapacity(flat_size_ + 1);
  return Insert(key);
}